

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_firedemon.cpp
# Opt level: O0

int AF_A_FiredSplotch(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  int iVar1;
  bool bVar2;
  bool local_96;
  bool local_93;
  DVector3 local_90;
  FName local_74;
  DVector3 local_70;
  FName local_54;
  AActor *local_50;
  AActor *mo;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  VMValue *pVStack_18;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pVStack_18 = param;
  param_local = (VMValue *)stack;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_firedemon.cpp"
                  ,0xe5,"int AF_A_FiredSplotch(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar2) {
    stateowner = (AActor *)(param->field_0).field_1.a;
    local_93 = true;
    if (stateowner != (AActor *)0x0) {
      local_93 = DObject::IsKindOf((DObject *)stateowner,AActor::RegistrationInfo.MyClass);
    }
    if (local_93 == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_firedemon.cpp"
                    ,0xe5,"int AF_A_FiredSplotch(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_18[(int)self].field_0.field_3.Type != 0xff)) {
      bVar2 = false;
      if ((pVStack_18[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar2 = true, pVStack_18[(int)self].field_0.field_1.atag != 1)) {
        bVar2 = pVStack_18[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar2) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_firedemon.cpp"
                      ,0xe5,"int AF_A_FiredSplotch(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                     );
      }
      stateinfo = (FStateParamInfo *)pVStack_18[(int)self].field_0.field_1.a;
      local_96 = true;
      if ((DObject *)stateinfo != (DObject *)0x0) {
        local_96 = DObject::IsKindOf((DObject *)stateinfo,AActor::RegistrationInfo.MyClass);
      }
      if (local_96 == false) {
        __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_firedemon.cpp"
                      ,0xe5,"int AF_A_FiredSplotch(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                     );
      }
    }
    else {
      stateinfo = (FStateParamInfo *)stateowner;
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_18[(int)self].field_0.field_3.Type != 0xff)) {
      bVar2 = false;
      if ((pVStack_18[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar2 = true, pVStack_18[(int)self].field_0.field_1.atag != 8)) {
        bVar2 = pVStack_18[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar2) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_firedemon.cpp"
                      ,0xe5,"int AF_A_FiredSplotch(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                     );
      }
      mo = (AActor *)pVStack_18[(int)self].field_0.field_1.a;
    }
    else {
      mo = (AActor *)0x0;
    }
    FName::FName(&local_54,"FireDemonSplotch1");
    AActor::Pos(&local_70,stateowner);
    local_50 = Spawn(&local_54,&local_70,ALLOW_REPLACE);
    if (local_50 != (AActor *)0x0) {
      iVar1 = FRandom::operator()(&pr_firedemonsplotch);
      (local_50->Vel).X = (double)(iVar1 + -0x80) / 32.0;
      iVar1 = FRandom::operator()(&pr_firedemonsplotch);
      (local_50->Vel).Y = (double)(iVar1 + -0x80) / 32.0;
      iVar1 = FRandom::operator()(&pr_firedemonsplotch);
      (local_50->Vel).Z = (double)iVar1 / 64.0 + 3.0;
    }
    FName::FName(&local_74,"FireDemonSplotch2");
    AActor::Pos(&local_90,stateowner);
    local_50 = Spawn(&local_74,&local_90,ALLOW_REPLACE);
    if (local_50 != (AActor *)0x0) {
      iVar1 = FRandom::operator()(&pr_firedemonsplotch);
      (local_50->Vel).X = (double)(iVar1 + -0x80) / 32.0;
      iVar1 = FRandom::operator()(&pr_firedemonsplotch);
      (local_50->Vel).Y = (double)(iVar1 + -0x80) / 32.0;
      iVar1 = FRandom::operator()(&pr_firedemonsplotch);
      (local_50->Vel).Z = (double)iVar1 / 64.0 + 3.0;
    }
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_firedemon.cpp"
                ,0xe5,"int AF_A_FiredSplotch(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FiredSplotch)
{
	PARAM_ACTION_PROLOGUE;

	AActor *mo;

	mo = Spawn ("FireDemonSplotch1", self->Pos(), ALLOW_REPLACE);
	if (mo)
	{
		mo->Vel.X = (pr_firedemonsplotch() - 128) / 32.;
		mo->Vel.Y = (pr_firedemonsplotch() - 128) / 32.;
		mo->Vel.Z = (pr_firedemonsplotch() / 64.) + 3;
	}
	mo = Spawn ("FireDemonSplotch2", self->Pos(), ALLOW_REPLACE);
	if (mo)
	{
		mo->Vel.X = (pr_firedemonsplotch() - 128) / 32.;
		mo->Vel.Y = (pr_firedemonsplotch() - 128) / 32.;
		mo->Vel.Z = (pr_firedemonsplotch() / 64.) + 3;
	}
	return 0;
}